

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O2

string * __thiscall
TwoStageDynamicBayesianNetwork::SoftPrintSoI_O_abi_cxx11_
          (string *__return_storage_ptr__,TwoStageDynamicBayesianNetwork *this,Index agI)

{
  ostream *poVar1;
  const_reference pvVar2;
  ulong __n;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"agI=");
  __n = (ulong)agI;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", XSoI_O=");
  pvVar2 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_XSoI_O,__n);
  poVar1 = ::operator<<(poVar1,pvVar2);
  poVar1 = std::operator<<(poVar1,", ASoI_O=");
  pvVar2 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_ASoI_O,__n);
  poVar1 = ::operator<<(poVar1,pvVar2);
  poVar1 = std::operator<<(poVar1,", YSoI_O=");
  pvVar2 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_YSoI_O,__n);
  poVar1 = ::operator<<(poVar1,pvVar2);
  poVar1 = std::operator<<(poVar1,", OSoI_O=");
  pvVar2 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_OSoI_O,__n);
  ::operator<<(poVar1,pvVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

string TwoStageDynamicBayesianNetwork::SoftPrintSoI_O(Index agI) const
{
    stringstream ss;
    ss << "agI=" << agI <<
        ", XSoI_O=" << _m_XSoI_O.at(agI) << 
        ", ASoI_O=" << _m_ASoI_O.at(agI) << 
        ", YSoI_O=" << _m_YSoI_O.at(agI) << 
        ", OSoI_O=" << _m_OSoI_O.at(agI);
    return(ss.str());
}